

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
Corrade::Containers::Implementation::CallDeleter<char32_t,_void_(*)(char32_t_*,_unsigned_long)>::
operator()(CallDeleter<char32_t,_void_(*)(char32_t_*,_unsigned_long)> *this,
          _func_void_char32_t_ptr_size_t *deleter,char32_t *data,size_t size)

{
  size_t size_local;
  char32_t *data_local;
  _func_void_char32_t_ptr_size_t *deleter_local;
  CallDeleter<char32_t,_void_(*)(char32_t_*,_unsigned_long)> *this_local;
  
  if (deleter == (_func_void_char32_t_ptr_size_t *)0x0) {
    if (data != (char32_t *)0x0) {
      operator_delete__(data);
    }
  }
  else {
    (*deleter)(data,size);
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }